

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

void VScaleBy_Serial(sunrealtype a,N_Vector x)

{
  long lVar1;
  long lVar2;
  sunrealtype *xd;
  sunindextype N;
  sunindextype i;
  N_Vector x_local;
  sunrealtype a_local;
  
  lVar1 = *x->content;
  lVar2 = *(long *)((long)x->content + 0x10);
  for (i = 0; i < lVar1; i = i + 1) {
    *(double *)(lVar2 + i * 8) = a * *(double *)(lVar2 + i * 8);
  }
  return;
}

Assistant:

static void VScaleBy_Serial(sunrealtype a, N_Vector x)
{
  sunindextype i, N;
  sunrealtype* xd;

  xd = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);

  for (i = 0; i < N; i++) { xd[i] *= a; }

  return;
}